

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

DdNode * Llb_Nonlin4Image(DdManager *dd,Vec_Ptr_t *vParts,DdNode *bCurrent,Vec_Int_t *vVars2Q)

{
  Llb_Prt_t *pPart;
  int iVar1;
  int iVar2;
  Llb_Mgr_t_conflict *p;
  DdNode *n;
  DdNode *n_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *local_40;
  Llb_Prt_t *local_38;
  
  uVar3 = 0;
  p = Llb_Nonlin4Alloc(dd,vParts,bCurrent,vVars2Q,0);
  uVar5 = (ulong)(uint)p->iPartFree;
  if (p->iPartFree < 1) {
    uVar5 = uVar3;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    pPart = p->pParts[uVar3];
    if ((pPart != (Llb_Prt_t *)0x0) && (iVar1 = Llb_Nonlin4HasSingletonVars(p,pPart), iVar1 != 0)) {
      Llb_Nonlin4Quantify1(p,pPart);
    }
  }
  Llb_Nonlin4RecomputeScores(p);
  while( true ) {
    iVar1 = Llb_Nonlin4NextPartitions(p,&local_38,&local_40);
    if (iVar1 == 0) {
      n = Cudd_ReadOne(p->dd);
      Cudd_Ref(n);
      for (lVar4 = 0; lVar4 < p->iPartFree; lVar4 = lVar4 + 1) {
        n_00 = n;
        if (p->pParts[lVar4] != (Llb_Prt_t *)0x0) {
          n_00 = Cudd_bddAnd(p->dd,n,p->pParts[lVar4]->bFunc);
          Cudd_Ref(n_00);
          Cudd_RecursiveDeref(p->dd,n);
        }
        n = n_00;
      }
      Llb_Nonlin4Free(p);
      Cudd_Deref(n);
      return n;
    }
    iVar1 = Cudd_ReadReorderings(dd);
    iVar2 = Llb_Nonlin4Quantify2(p,local_38,local_40);
    if (iVar2 == 0) break;
    iVar2 = Cudd_ReadReorderings(dd);
    if (iVar1 < iVar2) {
      Llb_Nonlin4RecomputeScores(p);
    }
  }
  Llb_Nonlin4Free(p);
  return (DdNode *)0x0;
}

Assistant:

DdNode * Llb_Nonlin4Image( DdManager * dd, Vec_Ptr_t * vParts, DdNode * bCurrent, Vec_Int_t * vVars2Q )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    DdNode * bFunc, * bTemp;
    int i, nReorders;
    // start the manager
    p = Llb_Nonlin4Alloc( dd, vParts, bCurrent, vVars2Q, 0 );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_Nonlin4HasSingletonVars(p, pPart) )
            Llb_Nonlin4Quantify1( p, pPart );
    // compute scores
    Llb_Nonlin4RecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_Nonlin4NextPartitions(p, &pPart1, &pPart2) )
    {
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_Nonlin4Quantify2( p, pPart1, pPart2 ) )
        {
            Llb_Nonlin4Free( p );
            return NULL;
        }
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_Nonlin4RecomputeScores( p );
//        else
//            Llb_Nonlin4VerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
//    nSuppMax = p->nSuppMax;
    Llb_Nonlin4Free( p );
//printf( "\n" );
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}